

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveGeneration.h
# Opt level: O1

void __thiscall
libchess::Position::generate_capture_promotions(Position *this,MoveList *move_list,Color stm)

{
  iterator iVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  Move local_44;
  undefined8 *local_40;
  ulong local_38;
  
  uVar6 = this->color_bb_[(int)stm.super_MetaValueType<int>.value_].value_ &
          this->piece_type_bb_[0].value_ &
          *(ulong *)(lookups::RANK_MASK +
                    (ulong)((uint)(stm.super_MetaValueType<int>.value_ == 0) * 0x28) + 8);
  if (uVar6 != 0) {
    local_38 = *(ulong *)((long)&this->color_bb_[0].value_ +
                         (ulong)((uint)(stm.super_MetaValueType<int>.value_ == 0) * 8));
    local_40 = &lookups::PAWN_ATTACKS + (long)(int)stm.super_MetaValueType<int>.value_ * 0x40;
    do {
      lVar2 = 0;
      if (uVar6 != 0) {
        for (; (uVar6 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
        }
      }
      for (uVar4 = local_40[lVar2] & local_38; uVar4 != 0; uVar4 = uVar4 & uVar4 - 1) {
        lVar3 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        uVar5 = (int)lVar3 * 0x40;
        local_44.value_ = uVar5 + 0x3c000 + (uint)lVar2;
        iVar1._M_current =
             (move_list->values_).
             super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<libchess::Move,std::allocator<libchess::Move>>::
          _M_realloc_insert<libchess::Move_const&>
                    ((vector<libchess::Move,std::allocator<libchess::Move>> *)move_list,iVar1,
                     &local_44);
        }
        else {
          (iVar1._M_current)->value_ = local_44.value_;
          (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        uVar5 = uVar5 | (uint)lVar2;
        local_44.value_ = uVar5 | 0x39000;
        iVar1._M_current =
             (move_list->values_).
             super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<libchess::Move,std::allocator<libchess::Move>>::
          _M_realloc_insert<libchess::Move_const&>
                    ((vector<libchess::Move,std::allocator<libchess::Move>> *)move_list,iVar1,
                     &local_44);
        }
        else {
          (iVar1._M_current)->value_ = local_44.value_;
          (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        local_44.value_ = uVar5 | 0x3b000;
        iVar1._M_current =
             (move_list->values_).
             super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<libchess::Move,std::allocator<libchess::Move>>::
          _M_realloc_insert<libchess::Move_const&>
                    ((vector<libchess::Move,std::allocator<libchess::Move>> *)move_list,iVar1,
                     &local_44);
        }
        else {
          (iVar1._M_current)->value_ = local_44.value_;
          (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        local_44.value_ = uVar5 | 0x3a000;
        iVar1._M_current =
             (move_list->values_).
             super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<libchess::Move,std::allocator<libchess::Move>>::
          _M_realloc_insert<libchess::Move_const&>
                    ((vector<libchess::Move,std::allocator<libchess::Move>> *)move_list,iVar1,
                     &local_44);
        }
        else {
          (iVar1._M_current)->value_ = local_44.value_;
          (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
      }
      uVar6 = uVar6 & uVar6 - 1;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

inline void Position::generate_capture_promotions(MoveList& move_list, Color stm) const {
    Bitboard pawn_bb = piece_type_bb(constants::PAWN);
    pawn_bb &= color_bb(stm) & lookups::relative_rank_mask(constants::RANK_7, stm);
    Bitboard opp_occupancy = color_bb(!stm);
    while (pawn_bb) {
        Square from_sq = pawn_bb.forward_bitscan();
        pawn_bb.forward_popbit();
        Bitboard attacks_bb = lookups::pawn_attacks(from_sq, stm) & opp_occupancy;
        while (attacks_bb) {
            Square to_sq = attacks_bb.forward_bitscan();
            attacks_bb.forward_popbit();
            move_list.add(Move{from_sq, to_sq, constants::QUEEN, Move::Type::CAPTURE_PROMOTION});
            move_list.add(Move{from_sq, to_sq, constants::KNIGHT, Move::Type::CAPTURE_PROMOTION});
            move_list.add(Move{from_sq, to_sq, constants::ROOK, Move::Type::CAPTURE_PROMOTION});
            move_list.add(Move{from_sq, to_sq, constants::BISHOP, Move::Type::CAPTURE_PROMOTION});
        }
    }
}